

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O1

void SoPlex_addColReal(void *soplex,double *colentries,int colsize,int nnonzeros,double objval,
                      double lb,double ub)

{
  uint n;
  ulong uVar1;
  DSVector col;
  DSVectorBase<double> local_a0;
  double local_80;
  double local_78;
  double local_70;
  LPColBase<double> local_68;
  
  local_a0.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  local_a0.super_SVectorBase<double>.memsize = 0;
  local_a0.super_SVectorBase<double>.memused = 0;
  local_a0._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
  local_a0.theelem = (Nonzero<double> *)0x0;
  n = 2;
  if (0 < nnonzeros) {
    n = nnonzeros;
  }
  local_80 = ub;
  local_78 = lb;
  local_70 = objval;
  ::soplex::spx_alloc<soplex::Nonzero<double>*>(&local_a0.theelem,n);
  local_a0.super_SVectorBase<double>.m_elem = local_a0.theelem;
  local_a0.super_SVectorBase<double>.memused = 0;
  local_a0.super_SVectorBase<double>.memsize = n;
  if (0 < colsize) {
    uVar1 = 0;
    do {
      if ((*colentries != 0.0) || (NAN(*colentries))) {
        ::soplex::DSVectorBase<double>::add(&local_a0,(int)uVar1,colentries);
      }
      uVar1 = uVar1 + 1;
      colentries = colentries + 1;
    } while ((uint)colsize != uVar1);
  }
  local_68.up = local_80;
  local_68.low = local_78;
  local_68.object = local_70;
  ::soplex::DSVectorBase<double>::DSVectorBase<double>
            (&local_68.vec,&local_a0.super_SVectorBase<double>);
  ::soplex::SoPlexBase<double>::addColReal((SoPlexBase<double> *)soplex,&local_68);
  local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
  if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
    free(local_68.vec.theelem);
    local_68.vec.theelem = (Nonzero<double> *)0x0;
  }
  local_a0._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003b0660;
  if (local_a0.theelem != (Nonzero<double> *)0x0) {
    free(local_a0.theelem);
  }
  return;
}

Assistant:

void SoPlex_addColReal(void* soplex, double* colentries, int colsize, int nnonzeros, double objval,
                       double lb, double ub)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector col(nnonzeros);

   /* add nonzero entries to column vector */
   for(int i = 0; i < colsize; ++i)
   {
      if(colentries[i] != 0.0)
         col.add(i, colentries[i]);
   }

   so->addColReal(LPCol(objval, col, ub, lb));
}